

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS
ref_recon_extrapolate_kexact(REF_GRID ref_grid,REF_DBL *recon,REF_BOOL *replace,REF_INT ldim)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT layer;
  REF_STATUS status;
  REF_DBL center;
  REF_CLOUD ref_cloud;
  REF_CLOUD *one_layer;
  REF_INT node;
  REF_INT i;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_BOOL *pRStack_28;
  REF_INT ldim_local;
  REF_BOOL *replace_local;
  REF_DBL *recon_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  _node = ref_grid->cell[8];
  if (ref_grid->twod != 0) {
    _node = ref_grid->cell[3];
  }
  ref_node._4_4_ = ldim;
  pRStack_28 = replace;
  replace_local = (REF_BOOL *)recon;
  recon_local = (REF_DBL *)ref_grid;
  uVar1 = ref_node_ghost_int((REF_NODE)ref_cell,replace,ldim);
  if (uVar1 == 0) {
    uVar1 = ref_node_ghost_dbl((REF_NODE)ref_cell,(REF_DBL *)replace_local,ref_node._4_4_);
    if (uVar1 == 0) {
      for (one_layer._4_4_ = 0; one_layer._4_4_ < ref_node._4_4_;
          one_layer._4_4_ = one_layer._4_4_ + 1) {
        if (ref_cell->last_node_is_an_id < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x4a7,"ref_recon_extrapolate_kexact","malloc one_layer of REF_CLOUD negative");
          return 1;
        }
        ref_cloud = (REF_CLOUD)malloc((long)ref_cell->last_node_is_an_id << 3);
        if (ref_cloud == (REF_CLOUD)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x4a7,"ref_recon_extrapolate_kexact","malloc one_layer of REF_CLOUD NULL");
          return 2;
        }
        for (ref_private_macro_code_rss_3 = 0;
            ref_private_macro_code_rss_3 < ref_cell->last_node_is_an_id;
            ref_private_macro_code_rss_3 = ref_private_macro_code_rss_3 + 1) {
          *(undefined8 *)(&ref_cloud->n + (long)ref_private_macro_code_rss_3 * 2) = 0;
        }
        for (one_layer._0_4_ = 0; (int)one_layer < ref_cell->last_node_is_an_id;
            one_layer._0_4_ = (int)one_layer + 1) {
          if ((((-1 < (int)one_layer) && ((int)one_layer < ref_cell->last_node_is_an_id)) &&
              (-1 < *(long *)(*(long *)&ref_cell->edge_per + (long)(int)one_layer * 8))) &&
             (uVar1 = ref_cloud_create((REF_CLOUD *)(&ref_cloud->n + (long)(int)one_layer * 2),4),
             uVar1 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x4a9,"ref_recon_extrapolate_kexact",(ulong)uVar1,"cloud storage");
            return uVar1;
          }
        }
        uVar1 = ref_recon_local_immediate_replace_cloud
                          ((REF_CLOUD *)ref_cloud,(REF_NODE)ref_cell,_node,(REF_DBL *)replace_local,
                           pRStack_28,ref_node._4_4_,one_layer._4_4_);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x4ad,"ref_recon_extrapolate_kexact",(ulong)uVar1,"fill");
          return uVar1;
        }
        uVar1 = ref_recon_ghost_cloud((REF_CLOUD *)ref_cloud,(REF_NODE)ref_cell);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x4ae,"ref_recon_extrapolate_kexact",(ulong)uVar1,"fill ghosts");
          return uVar1;
        }
        for (one_layer._0_4_ = 0; (int)one_layer < ref_cell->last_node_is_an_id;
            one_layer._0_4_ = (int)one_layer + 1) {
          if (((-1 < (int)one_layer) && ((int)one_layer < ref_cell->last_node_is_an_id)) &&
             ((-1 < *(long *)(*(long *)&ref_cell->edge_per + (long)(int)one_layer * 8) &&
              ((*(int *)(*(long *)&ref_cell[1].size_per + 4) ==
                *(int *)(*(long *)&ref_cell->n + (long)(int)one_layer * 4) &&
               (pRStack_28[one_layer._4_4_ + ref_node._4_4_ * (int)one_layer] != 0)))))) {
            uVar1 = ref_cloud_deep_copy((REF_CLOUD *)&center,
                                        *(REF_CLOUD *)(&ref_cloud->n + (long)(int)one_layer * 2));
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x4b2,"ref_recon_extrapolate_kexact",(ulong)uVar1,"create ref_cloud");
              return uVar1;
            }
            ref_private_macro_code_rss = 3;
            for (ref_private_macro_code_rss_1 = 2;
                ref_private_macro_code_rss != 0 && ref_private_macro_code_rss_1 < 9;
                ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
              ref_private_macro_code_rss =
                   ref_recon_kexact_center
                             ((REF_DBL *)(ref_cell->c2n + (long)((int)one_layer * 0xf) * 2),
                              (REF_CLOUD)center,(REF_DBL *)&layer);
              if (ref_private_macro_code_rss == 0) {
                *(REF_DBL *)
                 (replace_local + (long)(one_layer._4_4_ + ref_node._4_4_ * (int)one_layer) * 2) =
                     _layer;
                pRStack_28[one_layer._4_4_ + ref_node._4_4_ * (int)one_layer] = 0;
              }
              else {
                uVar1 = ref_recon_grow_cloud_one_layer
                                  ((REF_CLOUD)center,(REF_CLOUD *)ref_cloud,(REF_NODE)ref_cell);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x4bc,"ref_recon_extrapolate_kexact",(ulong)uVar1,"grow");
                  return uVar1;
                }
              }
            }
            uVar1 = ref_cloud_free((REF_CLOUD)center);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x4bf,"ref_recon_extrapolate_kexact",(ulong)uVar1,"free ref_cloud");
              return uVar1;
            }
          }
        }
        for (one_layer._0_4_ = 0; (int)one_layer < ref_cell->last_node_is_an_id;
            one_layer._0_4_ = (int)one_layer + 1) {
          if (((-1 < (int)one_layer) && ((int)one_layer < ref_cell->last_node_is_an_id)) &&
             (-1 < *(long *)(*(long *)&ref_cell->edge_per + (long)(int)one_layer * 8))) {
            ref_cloud_free(*(REF_CLOUD *)(&ref_cloud->n + (long)(int)one_layer * 2));
          }
        }
        if (ref_cloud != (REF_CLOUD)0x0) {
          free(ref_cloud);
        }
      }
      uVar1 = ref_node_ghost_int((REF_NODE)ref_cell,pRStack_28,ref_node._4_4_);
      if (uVar1 == 0) {
        uVar1 = ref_node_ghost_dbl((REF_NODE)ref_cell,(REF_DBL *)replace_local,ref_node._4_4_);
        if (uVar1 == 0) {
          ref_grid_local._4_4_ =
               ref_recon_extrapolate_zeroth
                         ((REF_GRID)recon_local,(REF_DBL *)replace_local,pRStack_28,ref_node._4_4_);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x4cc,"ref_recon_extrapolate_kexact",(ulong)ref_grid_local._4_4_,"zero");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x4ca,"ref_recon_extrapolate_kexact",(ulong)uVar1,"update ghosts");
          ref_grid_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x4c9,"ref_recon_extrapolate_kexact",(ulong)uVar1,"update ghosts");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x4a4
             ,"ref_recon_extrapolate_kexact",(ulong)uVar1,"update ghosts");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x4a3,
           "ref_recon_extrapolate_kexact",(ulong)uVar1,"update ghosts");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_recon_extrapolate_kexact(REF_GRID ref_grid,
                                                REF_DBL *recon,
                                                REF_BOOL *replace,
                                                REF_INT ldim) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT i, node;
  REF_CLOUD *one_layer, ref_cloud;
  REF_DBL center;
  REF_STATUS status;
  REF_INT layer;
  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  RSS(ref_node_ghost_int(ref_node, replace, ldim), "update ghosts");
  RSS(ref_node_ghost_dbl(ref_node, recon, ldim), "update ghosts");

  for (i = 0; i < ldim; i++) {
    ref_malloc_init(one_layer, ref_node_max(ref_node), REF_CLOUD, NULL);
    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_cloud_create(&(one_layer[node]), 4), "cloud storage");
    }
    RSS(ref_recon_local_immediate_replace_cloud(one_layer, ref_node, ref_cell,
                                                recon, replace, ldim, i),
        "fill");
    RSS(ref_recon_ghost_cloud(one_layer, ref_node), "fill ghosts");
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_owned(ref_node, node) && replace[i + ldim * node]) {
        RSS(ref_cloud_deep_copy(&ref_cloud, one_layer[node]),
            "create ref_cloud");
        status = REF_INVALID;
        for (layer = 2; status != REF_SUCCESS && layer <= 8; layer++) {
          status = ref_recon_kexact_center(ref_node_xyz_ptr(ref_node, node),
                                           ref_cloud, &center);
          if (REF_SUCCESS == status) {
            recon[i + ldim * node] = center;
            replace[i + ldim * node] = REF_FALSE;
          } else {
            RSS(ref_recon_grow_cloud_one_layer(ref_cloud, one_layer, ref_node),
                "grow");
          }
        }
        RSS(ref_cloud_free(ref_cloud), "free ref_cloud");
      }
    }

    each_ref_node_valid_node(ref_node, node) {
      ref_cloud_free(one_layer[node]); /* no-op for null */
    }
    ref_free(one_layer);
  }

  RSS(ref_node_ghost_int(ref_node, replace, ldim), "update ghosts");
  RSS(ref_node_ghost_dbl(ref_node, recon, ldim), "update ghosts");

  RSS(ref_recon_extrapolate_zeroth(ref_grid, recon, replace, ldim), "zero");

  return REF_SUCCESS;
}